

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O1

void Ivy_FastMapMark_rec(Ivy_Man_t *pAig,Ivy_Obj_t *pObj)

{
  if (pObj->TravId != pAig->nTravIds) {
    if ((*(uint *)&pObj->field_0x8 & 0xf) - 7 < 0xfffffffe) {
      __assert_fail("Ivy_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                    ,0x462,"void Ivy_FastMapMark_rec(Ivy_Man_t *, Ivy_Obj_t *)");
    }
    Ivy_FastMapMark_rec(pAig,(Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Ivy_FastMapMark_rec(pAig,(Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    pObj->TravId = pAig->nTravIds;
  }
  return;
}

Assistant:

void Ivy_FastMapMark_rec( Ivy_Man_t * pAig, Ivy_Obj_t * pObj )
{
    if ( Ivy_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    assert( Ivy_ObjIsNode(pObj) );
    Ivy_FastMapMark_rec( pAig, Ivy_ObjFanin0(pObj) );
    Ivy_FastMapMark_rec( pAig, Ivy_ObjFanin1(pObj) );
    Ivy_ObjSetTravIdCurrent(pAig, pObj);
}